

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

Status __thiscall leveldb::VersionSet::WriteSnapshot(VersionSet *this,Writer *log)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  VersionSet *pVVar3;
  int iVar4;
  undefined4 extraout_var;
  long lVar5;
  Slice *in_RDX;
  uint32_t *puVar6;
  ulong uVar7;
  int level;
  long lVar8;
  string record;
  VersionEdit edit;
  string local_118;
  Slice *local_f8;
  VersionSet *local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8;
  size_type sStack_e0;
  VersionEdit local_d8;
  
  local_f8 = in_RDX;
  local_f0 = this;
  VersionEdit::VersionEdit(&local_d8);
  iVar4 = (*(log[2].dest_)->_vptr_WritableFile[3])();
  local_118._M_dataplus._M_p = (pointer)CONCAT44(extraout_var,iVar4);
  local_118._M_string_length = strlen(local_118._M_dataplus._M_p);
  VersionEdit::SetComparatorName(&local_d8,(Slice *)&local_118);
  paVar1 = &local_118.field_2;
  puVar6 = log[0xb].type_crc_ + 3;
  lVar8 = 0;
  do {
    if (*(long *)puVar6 != 0) {
      local_118._M_string_length = 0;
      local_118.field_2._M_local_buf[0] = '\0';
      local_118._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_replace((ulong)&local_118,0,(char *)0x0,*(ulong *)(puVar6 + -2));
      VersionEdit::SetCompactPointer(&local_d8,(int)lVar8,(InternalKey *)&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar1) {
        operator_delete(local_118._M_dataplus._M_p);
      }
    }
    lVar8 = lVar8 + 1;
    puVar6 = puVar6 + 8;
  } while (lVar8 != 7);
  lVar8 = 0;
  do {
    lVar2 = *(long *)&log[0xb].block_offset_;
    lVar5 = *(long *)(lVar2 + 0x20 + lVar8 * 0x18);
    if (*(long *)(lVar2 + 0x28 + lVar8 * 0x18) != lVar5) {
      lVar2 = lVar2 + lVar8 * 0x18;
      uVar7 = 0;
      do {
        lVar5 = *(long *)(lVar5 + uVar7 * 8);
        VersionEdit::AddFile
                  (&local_d8,(int)lVar8,*(uint64_t *)(lVar5 + 8),*(uint64_t *)(lVar5 + 0x10),
                   (InternalKey *)(lVar5 + 0x18),(InternalKey *)(lVar5 + 0x38));
        uVar7 = uVar7 + 1;
        lVar5 = *(long *)(lVar2 + 0x20);
      } while (uVar7 < (ulong)(*(long *)(lVar2 + 0x28) - lVar5 >> 3));
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 7);
  local_118._M_string_length = 0;
  local_118.field_2._M_local_buf[0] = '\0';
  local_118._M_dataplus._M_p = (pointer)paVar1;
  VersionEdit::EncodeTo(&local_d8,&local_118);
  pVVar3 = local_f0;
  local_e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_118._M_dataplus._M_p;
  sStack_e0 = local_118._M_string_length;
  leveldb::log::Writer::AddRecord((Writer *)local_f0,local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar1) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  VersionEdit::~VersionEdit(&local_d8);
  return (Status)(char *)pVVar3;
}

Assistant:

Status VersionSet::WriteSnapshot(log::Writer* log) {
  // TODO: Break up into multiple records to reduce memory usage on recovery?

  // Save metadata
  VersionEdit edit;
  edit.SetComparatorName(icmp_.user_comparator()->Name());

  // Save compaction pointers
  for (int level = 0; level < config::kNumLevels; level++) {
    if (!compact_pointer_[level].empty()) {
      InternalKey key;
      key.DecodeFrom(compact_pointer_[level]);
      edit.SetCompactPointer(level, key);
    }
  }

  // Save files
  for (int level = 0; level < config::kNumLevels; level++) {
    const std::vector<FileMetaData*>& files = current_->files_[level];
    for (size_t i = 0; i < files.size(); i++) {
      const FileMetaData* f = files[i];
      edit.AddFile(level, f->number, f->file_size, f->smallest, f->largest);
    }
  }

  std::string record;
  edit.EncodeTo(&record);
  return log->AddRecord(record);
}